

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

int vm_new_pkg(VM *vm,uint64_t name)

{
  int pkg_idx;
  int iVar1;
  Package *__ptr;
  
  pkg_idx = vm->pkgs_count;
  iVar1 = vm->pkgs_capacity;
  __ptr = vm->pkgs;
  if (iVar1 <= pkg_idx) {
    vm->pkgs_capacity = iVar1 * 2;
    __ptr = (Package *)realloc(__ptr,(long)iVar1 << 5);
    vm->pkgs = __ptr;
    pkg_idx = vm->pkgs_count;
  }
  vm->pkgs_count = pkg_idx + 1;
  __ptr[pkg_idx].name = name;
  iVar1 = vm_new_fn(vm,pkg_idx);
  __ptr[pkg_idx].main_fn = iVar1;
  return vm->pkgs_count + -1;
}

Assistant:

int vm_new_pkg(VM *vm, uint64_t name) {
	if (vm->pkgs_count >= vm->pkgs_capacity) {
		vm->pkgs_capacity *= 2;
		vm->pkgs = realloc(vm->pkgs, sizeof(Package) * vm->pkgs_capacity);
	}

	Package *pkg = &vm->pkgs[vm->pkgs_count++];
	pkg->name = name;
	pkg->main_fn = vm_new_fn(vm, vm->pkgs_count - 1);
	return vm->pkgs_count - 1;
}